

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser_Y.cpp
# Opt level: O3

void amrex::parser_ast_setconst(parser_node *node,char *name,double c)

{
  parser_node_t pVar1;
  parser_node_t __val;
  uint uVar2;
  int iVar3;
  long lVar4;
  long *plVar5;
  uint uVar6;
  size_type *psVar7;
  ulong uVar8;
  uint __len;
  string __str;
  string local_68;
  long *local_48 [2];
  long local_38 [2];
  
  do {
    pVar1 = node->type;
    switch(pVar1) {
    case PARSER_NUMBER:
      goto switchD_007247ed_caseD_1;
    case PARSER_SYMBOL:
      iVar3 = strcmp(name,(char *)node->l);
      if (iVar3 != 0) {
        return;
      }
      node->type = PARSER_NUMBER;
      node->l = (parser_node *)c;
      return;
    case PARSER_ADD:
    case PARSER_SUB:
    case PARSER_MUL:
    case PARSER_DIV:
    case PARSER_F2:
    case PARSER_LIST:
    case PARSER_ADD_PP:
    case PARSER_SUB_PP:
    case PARSER_MUL_PP:
    case PARSER_DIV_PP:
      parser_ast_setconst(node->l,name,c);
    case PARSER_ASSIGN:
    case PARSER_ADD_VP:
    case PARSER_SUB_VP:
    case PARSER_MUL_VP:
    case PARSER_DIV_VP:
      lVar4 = 0x10;
      break;
    case PARSER_NEG:
    case PARSER_F1:
    case PARSER_NEG_P:
      lVar4 = 8;
      break;
    case PARSER_F3:
      parser_ast_setconst(node->l,name,c);
      parser_ast_setconst(node->r,name,c);
      lVar4 = 0x18;
      break;
    default:
      __val = -pVar1;
      if (0 < (int)pVar1) {
        __val = pVar1;
      }
      __len = 1;
      if (__val < PARSER_F3) goto LAB_007248bf;
      uVar8 = (ulong)__val;
      uVar2 = 4;
      goto LAB_00724887;
    }
    node = *(parser_node **)((long)&node->type + lVar4);
  } while( true );
LAB_00724887:
  __len = uVar2;
  uVar6 = (uint)uVar8;
  if (uVar6 < 100) {
    __len = __len - 2;
    goto LAB_007248bf;
  }
  if (uVar6 < 1000) {
    __len = __len - 1;
    goto LAB_007248bf;
  }
  if (uVar6 < 10000) goto LAB_007248bf;
  uVar8 = uVar8 / 10000;
  uVar2 = __len + 4;
  if (uVar6 < 100000) {
    __len = __len + 1;
LAB_007248bf:
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct((ulong)local_48,(char)__len - (char)((int)pVar1 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)local_48[0] + (ulong)(pVar1 >> 0x1f)),__len,__val);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)local_48,0,(char *)0x0,0x779cca);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_68.field_2._M_allocated_capacity = *psVar7;
      local_68.field_2._8_8_ = plVar5[3];
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    }
    else {
      local_68.field_2._M_allocated_capacity = *psVar7;
      local_68._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_68._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    Abort(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
switchD_007247ed_caseD_1:
    return;
  }
  goto LAB_00724887;
}

Assistant:

void parser_ast_setconst (struct parser_node* node, char const* name, double c)
{
    switch (node->type)
    {
    case PARSER_NUMBER:
        break;
    case PARSER_SYMBOL:
        if (std::strcmp(name, ((struct parser_symbol*)node)->name) == 0) {
            ((struct parser_number*)node)->type = PARSER_NUMBER;
            ((struct parser_number*)node)->value = c;
        }
        break;
    case PARSER_ADD:
    case PARSER_SUB:
    case PARSER_MUL:
    case PARSER_DIV:
    case PARSER_ADD_PP:
    case PARSER_SUB_PP:
    case PARSER_MUL_PP:
    case PARSER_DIV_PP:
    case PARSER_LIST:
        parser_ast_setconst(node->l, name, c);
        parser_ast_setconst(node->r, name, c);
        break;
    case PARSER_NEG:
    case PARSER_NEG_P:
        parser_ast_setconst(node->l, name, c);
        break;
    case PARSER_F1:
        parser_ast_setconst(((struct parser_f1*)node)->l, name, c);
        break;
    case PARSER_F2:
        parser_ast_setconst(((struct parser_f2*)node)->l, name, c);
        parser_ast_setconst(((struct parser_f2*)node)->r, name, c);
        break;
    case PARSER_F3:
        parser_ast_setconst(((struct parser_f3*)node)->n1, name, c);
        parser_ast_setconst(((struct parser_f3*)node)->n2, name, c);
        parser_ast_setconst(((struct parser_f3*)node)->n3, name, c);
        break;
    case PARSER_ASSIGN:
        parser_ast_setconst(((struct parser_assign*)node)->v, name, c);
        break;
    case PARSER_ADD_VP:
    case PARSER_SUB_VP:
    case PARSER_MUL_VP:
    case PARSER_DIV_VP:
        parser_ast_setconst(node->r, name, c);
        break;
    default:
        amrex::Abort("parser_ast_setconst: unknown node type " + std::to_string(node->type));
    }
}